

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::BackgroundScanStack(Recycler *this)

{
  bool bVar1;
  DWORD DVar2;
  ConfigFlagsTable *pCVar3;
  void **obj;
  size_t size;
  char *stackTop;
  Recycler *this_local;
  
  if ((this->skipStack & 1U) == 0) {
    if (((this->isInScript & 1U) == 0) || (this->mainThreadHandle == (HANDLE)0x0)) {
      this_local = (Recycler *)0x0;
    }
    else {
      obj = (void **)GetScriptThreadStackTop(this);
      if (obj == (void **)0x0) {
        this_local = (Recycler *)0x0;
      }
      else {
        this_local = (Recycler *)((long)this->stackBase - (long)obj);
        ScanMemoryInline<false,false>(this,obj,(size_t)this_local);
      }
    }
  }
  else {
    pCVar3 = GetRecyclerFlagsTable(this);
    bVar1 = Js::Phases::IsEnabled(&pCVar3->Trace,ScanStackPhase);
    if ((bVar1) && (pCVar3 = GetRecyclerFlagsTable(this), (pCVar3->Verbose & 1U) != 0)) {
      DVar2 = GetCurrentThreadId();
      Output::Print(L"[%04X] Skipping the stack scan\n",(ulong)DVar2);
      Output::Flush();
    }
    this_local = (Recycler *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t
Recycler::BackgroundScanStack()
{
    if (this->skipStack)
    {
#ifdef RECYCLER_TRACE
        CUSTOM_PHASE_PRINT_VERBOSE_TRACE1(GetRecyclerFlagsTable(), Js::ScanStackPhase, _u("[%04X] Skipping the stack scan\n"), ::GetCurrentThreadId());
#endif
        return 0;
    }

    if (!this->isInScript || mainThreadHandle == nullptr)
    {
        // No point in scanning the main thread's stack if we are not in script
        // We also can't scan the main thread's stack if we are not thread bounded, and didn't create the main thread's handle
        return 0;
    }

    char* stackTop = this->GetScriptThreadStackTop();

    if (stackTop != nullptr)
    {
        size_t size = (char *)stackBase - stackTop;
        ScanMemoryInline<false>((void **)stackTop, size
            ADDRESS_SANITIZER_APPEND(RecyclerScanMemoryType::Stack));
        return size;
    }

    return 0;
}